

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_DetectsPrimalInfeasible_Test::TestBody
          (OsqpTest_DetectsPrimalInfeasible_Test *this)

{
  CoeffReturnType CVar1;
  CoeffReturnType CVar2;
  FloatingEqMatcher<double> matcher;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  double in_stack_fffffffffffffb60;
  AssertHelper local_440;
  Message local_438;
  double local_430;
  double local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_3;
  Message local_408;
  double local_400;
  CoeffReturnType local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_2;
  Message local_3d8;
  double local_3d0;
  FloatingEqMatcher<double> local_3c8;
  char local_3b0 [24];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_1;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> cert;
  Message local_368;
  OsqpExitCode local_360;
  OsqpExitCode local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar;
  string local_340;
  AssertHelper local_320;
  Message local_318;
  Status local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_;
  OsqpSettings settings;
  OsqpSolver solver;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_240;
  StorageIndex *local_220;
  Scalar local_218;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_210;
  Scalar local_1f0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  undefined1 local_1c8 [8];
  OsqpInstance instance;
  Triplet<double,_int> *local_100;
  double local_f8;
  int local_f0 [2];
  double local_e8;
  int local_e0 [2];
  undefined1 local_d8 [8];
  Triplet<double,_int> kTripletsQ [2];
  undefined1 local_a0 [8];
  SparseMatrix<double,_0,_int> constraint_matrix;
  SparseMatrix<double,_0,_int> objective_matrix;
  OsqpTest_DetectsPrimalInfeasible_Test *this_local;
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&constraint_matrix.m_data.m_allocatedSize,1,1);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix((SparseMatrix<double,_0,_int> *)local_a0,2,1);
  local_e0[1] = 0;
  local_e0[0] = 0;
  local_e8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)local_d8,local_e0 + 1,local_e0,&local_e8);
  local_f0[1] = 1;
  local_f0[0] = 0;
  local_f8 = 1.0;
  Eigen::Triplet<double,_int>::Triplet
            ((Triplet<double,_int> *)&kTripletsQ[0].m_value,local_f0 + 1,local_f0,&local_f8);
  local_100 = std::begin<Eigen::Triplet<double,int>const,2ul>
                        ((Triplet<double,_int> (*) [2])local_d8);
  instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = (Index)std::end<Eigen::Triplet<double,int>const,2ul>
                            ((Triplet<double,_int> (*) [2])local_d8);
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)local_a0,&local_100,
             (Triplet<double,_int> **)
             &instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows);
  OsqpInstance::OsqpInstance((OsqpInstance *)local_1c8);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_1c8,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
             &constraint_matrix.m_data.m_allocatedSize);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,1);
  local_1f0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_1e8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.objective_matrix.m_data.m_allocatedSize,&local_1f0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_1e8);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)
             &instance.objective_vector.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_a0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,2);
  local_218 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_210,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.constraint_matrix.m_data.m_allocatedSize,&local_218);
  local_220 = (StorageIndex *)0x4008000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (&local_210,(Scalar *)&local_220);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_210);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,2);
  solver.workspace_._M_t.
  super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
  super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>)
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)
       0x4000000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_240,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,(Scalar *)&solver);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (&local_240,(Scalar *)&(anonymous_namespace)::kInfinity);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_240);
  OsqpSolver::OsqpSolver((OsqpSolver *)&settings.time_limit);
  OsqpSettings::OsqpSettings((OsqpSettings *)&gtest_ar_.message_);
  OsqpSolver::Init((OsqpSolver *)&local_310,(OsqpInstance *)&settings.time_limit,
                   (OsqpSettings *)local_1c8);
  local_301 = absl::Status::ok(&local_310);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  absl::Status::~Status(&local_310);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar3) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_340,(internal *)local_300,
               (AssertionResult *)"solver.Init(instance, settings).ok()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xdd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    testing::Message::~Message(&local_318);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_35c = OsqpSolver::Solve((OsqpSolver *)&settings.time_limit);
    local_360 = kPrimalInfeasible;
    testing::internal::EqHelper::Compare<osqp::OsqpExitCode,_osqp::OsqpExitCode,_nullptr>
              ((EqHelper *)local_358,"solver.Solve()","OsqpExitCode::kPrimalInfeasible",&local_35c,
               &local_360);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar3) {
      testing::Message::Message(&local_368);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &cert.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .field_0x10,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0xde,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &cert.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .field_0x10,&local_368);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &cert.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .field_0x10);
      testing::Message::~Message(&local_368);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      OsqpSolver::primal_infeasibility_certificate
                ((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &gtest_ar_1.message_,(OsqpSolver *)&settings.time_limit);
      testing::DoubleNear(&local_3c8,-1.0,1e-05);
      matcher._8_8_ = local_3c8.max_abs_error_;
      matcher.expected_ = (double)local_3c8._8_8_;
      matcher.max_abs_error_ = in_stack_fffffffffffffb60;
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::internal::FloatingEqMatcher<double>>(matcher);
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator[]((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)&gtest_ar_1.message_,0);
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator[]((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)&gtest_ar_1.message_,1);
      local_3d0 = CVar1 / CVar2;
      testing::internal::PredicateFormatterFromMatcher<testing::internal::FloatingEqMatcher<double>>
      ::operator()(local_398,local_3b0,(double *)"cert[0] / cert[1]");
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
      if (!bVar3) {
        testing::Message::Message(&local_3d8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe3,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_3d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
      local_3f8 = Eigen::
                  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  ::operator[]((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                *)&gtest_ar_1.message_,1);
      local_400 = 0.0;
      testing::internal::CmpHelperLE<double,double>
                ((internal *)local_3f0,"cert[1]","0.0",&local_3f8,&local_400);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
      if (!bVar3) {
        testing::Message::Message(&local_408);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_408);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_408);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator[]((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)&gtest_ar_1.message_,0);
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator[]((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)&gtest_ar_1.message_,1);
      local_428 = CVar1 + CVar1 + CVar2 * 3.0;
      local_430 = 0.0;
      testing::internal::CmpHelperLT<double,double>
                ((internal *)local_420,"cert[0] * 2 + cert[1] * 3","0.0",&local_428,&local_430);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
      if (!bVar3) {
        testing::Message::Message(&local_438);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_440,&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        testing::Message::~Message(&local_438);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  OsqpSolver::~OsqpSolver((OsqpSolver *)&settings.time_limit);
  OsqpInstance::~OsqpInstance((OsqpInstance *)local_1c8);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_a0);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&constraint_matrix.m_data.m_allocatedSize);
  return;
}

Assistant:

TEST(OsqpTest, DetectsPrimalInfeasible) {
  // Minimize 0 subject to:
  // x == 2, x >= 3.
  SparseMatrix<double> objective_matrix(1, 1);

  SparseMatrix<double> constraint_matrix(2, 1);
  const Triplet<double> kTripletsQ[] = {{0, 0, 1.0}, {1, 0, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsQ),
                                    std::end(kTripletsQ));

  OsqpInstance instance;
  instance.objective_matrix = objective_matrix;
  instance.objective_vector.resize(1);
  instance.objective_vector << 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(2);
  instance.lower_bounds << 2, 3;
  instance.upper_bounds.resize(2);
  instance.upper_bounds << 2, kInfinity;

  OsqpSolver solver;
  OsqpSettings settings;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kPrimalInfeasible);
  Eigen::Map<const VectorXd> cert = solver.primal_infeasibility_certificate();
  // The infeasibility certificate satisfies cert[0] + cert[1] == 0,
  // cert[0]* 2 + cert[1] * 3 < 0, and cert[1] <= 0. See the OSQP documentation
  // for the general definition of the certificate.
  EXPECT_THAT(cert[0] / cert[1], DoubleNear(-1.0, kTolerance));
  EXPECT_LE(cert[1], 0.0);
  EXPECT_LT(cert[0] * 2 + cert[1] * 3, 0.0);
}